

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Dial.cxx
# Opt level: O0

int __thiscall Fl_Dial::handle(Fl_Dial *this,int event,int X,int Y,int W,int H)

{
  short sVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_XMM0_Db;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined8 in_XMM1_Qa;
  undefined4 uVar10;
  double local_68;
  double val;
  double oldangle;
  double angle;
  int my;
  int mx;
  Fl_Widget_Tracker local_38;
  Fl_Widget_Tracker wp;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  int event_local;
  Fl_Dial *this_local;
  
  uVar10 = (undefined4)((ulong)in_XMM1_Qa >> 0x20);
  wp.wp_._4_4_ = H;
  switch(event) {
  case 1:
    Fl_Widget_Tracker::Fl_Widget_Tracker(&local_38,(Fl_Widget *)this);
    Fl_Valuator::handle_push(&this->super_Fl_Valuator);
    iVar3 = Fl_Widget_Tracker::deleted(&local_38);
    if (iVar3 != 0) {
      this_local._4_4_ = 1;
    }
    Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_38);
    if (iVar3 != 0) {
      return this_local._4_4_;
    }
  case 5:
    iVar3 = Fl::event_x();
    iVar3 = ((iVar3 - X) - W / 2) * wp.wp_._4_4_;
    iVar4 = Fl::event_y();
    iVar4 = ((iVar4 - Y) - wp.wp_._4_4_ / 2) * W;
    if ((iVar3 == 0) && (iVar4 == 0)) {
      return 1;
    }
    dVar5 = std::atan2((double)CONCAT44(extraout_XMM0_Db,(float)-iVar4),
                       (double)CONCAT44(uVar10,(float)iVar3));
    sVar1 = *(short *)&(this->super_Fl_Valuator).field_0xa6;
    sVar2 = *(short *)&(this->super_Fl_Valuator).field_0xa4;
    dVar6 = Fl_Valuator::value(&this->super_Fl_Valuator);
    dVar7 = Fl_Valuator::minimum(&this->super_Fl_Valuator);
    dVar8 = Fl_Valuator::maximum(&this->super_Fl_Valuator);
    dVar9 = Fl_Valuator::minimum(&this->super_Fl_Valuator);
    dVar6 = ((double)((int)sVar1 - (int)sVar2) * (dVar6 - dVar7)) / (dVar8 - dVar9) +
            (double)(int)*(short *)&(this->super_Fl_Valuator).field_0xa4;
    for (oldangle = 270.0 - (double)(SUB84(dVar5,0) * 180.0) / 3.141592653589793;
        oldangle < dVar6 - 180.0; oldangle = oldangle + 360.0) {
    }
    for (; dVar6 + 180.0 < oldangle; oldangle = oldangle - 360.0) {
    }
    if (*(short *)&(this->super_Fl_Valuator).field_0xa4 <
        *(short *)&(this->super_Fl_Valuator).field_0xa6) {
      if ((double)(int)*(short *)&(this->super_Fl_Valuator).field_0xa4 < oldangle)
      goto LAB_001df00f;
LAB_001deffc:
      local_68 = Fl_Valuator::minimum(&this->super_Fl_Valuator);
    }
    else {
      if ((double)(int)*(short *)&(this->super_Fl_Valuator).field_0xa4 <= oldangle)
      goto LAB_001deffc;
LAB_001df00f:
      if (*(short *)&(this->super_Fl_Valuator).field_0xa4 <
          *(short *)&(this->super_Fl_Valuator).field_0xa6) {
        if ((double)(int)*(short *)&(this->super_Fl_Valuator).field_0xa6 <= oldangle) {
LAB_001df05b:
          local_68 = Fl_Valuator::maximum(&this->super_Fl_Valuator);
          goto LAB_001df0ec;
        }
      }
      else if (oldangle <= (double)(int)*(short *)&(this->super_Fl_Valuator).field_0xa6)
      goto LAB_001df05b;
      local_68 = Fl_Valuator::minimum(&this->super_Fl_Valuator);
      dVar5 = Fl_Valuator::maximum(&this->super_Fl_Valuator);
      dVar6 = Fl_Valuator::minimum(&this->super_Fl_Valuator);
      local_68 = local_68 +
                 ((dVar5 - dVar6) *
                 (oldangle - (double)(int)*(short *)&(this->super_Fl_Valuator).field_0xa4)) /
                 (double)((int)*(short *)&(this->super_Fl_Valuator).field_0xa6 -
                         (int)*(short *)&(this->super_Fl_Valuator).field_0xa4);
    }
LAB_001df0ec:
    dVar5 = Fl_Valuator::round(&this->super_Fl_Valuator,local_68);
    dVar5 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar5);
    Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar5);
    this_local._4_4_ = 1;
    break;
  case 2:
    Fl_Valuator::handle_release(&this->super_Fl_Valuator);
    this_local._4_4_ = 1;
    break;
  case 3:
  case 4:
    this_local._4_4_ = 1;
    break;
  default:
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Dial::handle(int event, int X, int Y, int W, int H) {
  switch (event) {
  case FL_PUSH: {
    Fl_Widget_Tracker wp(this);  
    handle_push();
    if (wp.deleted()) return 1; }
  case FL_DRAG: {
    int mx = (Fl::event_x()-X-W/2)*H;
    int my = (Fl::event_y()-Y-H/2)*W;
    if (!mx && !my) return 1;
    double angle = 270-atan2((float)-my, (float)mx)*180/M_PI;
    double oldangle = (a2-a1)*(value()-minimum())/(maximum()-minimum()) + a1;
    while (angle < oldangle-180) angle += 360;
    while (angle > oldangle+180) angle -= 360;
    double val;
    if ((a1<a2) ? (angle <= a1) : (angle >= a1)) {
      val = minimum();
    } else if ((a1<a2) ? (angle >= a2) : (angle <= a2)) {
      val = maximum();
    } else {
      val = minimum() + (maximum()-minimum())*(angle-a1)/(a2-a1);
    }
    handle_drag(clamp(round(val)));
  } return 1;
  case FL_RELEASE:
    handle_release();
    return 1;
  case FL_ENTER : /* FALLTHROUGH */
  case FL_LEAVE :
    return 1;
  default:
    return 0;
  }
}